

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n_pca.cpp
# Opt level: O2

void __thiscall n_pca::NPca::setTestMatrix(NPca *this,string *test_config_path)

{
  long lVar1;
  char cVar2;
  istream *piVar3;
  ulong uVar4;
  long lVar5;
  double *pdVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  allocator local_3b1 [9];
  vector<cv::Mat,_std::allocator<cv::Mat>_> image_data_;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  read_data;
  int local_370 [8];
  string input_str;
  Mat image;
  int local_328;
  int local_324;
  Exception e;
  ifstream file;
  
  if (test_config_path->_M_string_length != 0) {
    std::ifstream::ifstream(&file,(test_config_path->_M_dataplus)._M_p,_S_in);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      printf("couldn\'t open test_config_path: %s\n",(test_config_path->_M_dataplus)._M_p);
    }
    else {
      input_str._M_dataplus._M_p = (pointer)&input_str.field_2;
      input_str._M_string_length = 0;
      input_str.field_2._M_local_buf[0] = '\0';
      uVar8 = this->n_config_->image_width_ * this->n_config_->image_height_;
      image_data_.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      image_data_.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      image_data_.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      while( true ) {
        piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&file,(string *)&input_str);
        if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
        NConfig::n_split(&read_data,this->n_config_,&input_str,' ');
        if (0x20 < (ulong)((long)read_data.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)read_data.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)) {
          cv::Mat::Mat(&image);
          std::__cxx11::string::string
                    ((string *)local_370,
                     ((read_data.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,local_3b1);
          cv::imread((string *)&e,(int)(string *)local_370);
          cv::Mat::operator=(&image,(Mat *)&e);
          cv::Mat::~Mat((Mat *)&e);
          std::__cxx11::string::~string((string *)local_370);
          cVar2 = cv::Mat::empty();
          if (cVar2 == '\0') {
            if ((local_324 != this->n_config_->image_width_) ||
               (local_328 != this->n_config_->image_height_)) {
              n_resize(this,&image);
            }
            cv::Mat::reshape((int)(string *)&e,(int)&image);
            std::vector<cv::Mat,_std::allocator<cv::Mat>_>::push_back(&image_data_,(value_type *)&e)
            ;
            local_370[0] = atoi(read_data.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->test_label_,local_370);
            cv::Mat::~Mat((Mat *)&e);
          }
          cv::Mat::~Mat(&image);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&read_data);
      }
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
                ((ConstantReturnType *)&e,
                 ((long)image_data_.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)image_data_.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                       super__Vector_impl_data._M_start) / 0x60,(long)(int)uVar8);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                (&this->test_matrix_,
                 (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  *)&e);
      uVar4 = 0;
      uVar9 = (ulong)uVar8;
      if ((int)uVar8 < 1) {
        uVar9 = uVar4;
      }
      for (lVar5 = 0;
          lVar5 != ((long)image_data_.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)image_data_.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                         super__Vector_impl_data._M_start) / 0x60; lVar5 = lVar5 + 1) {
        lVar1 = (this->test_matrix_).
                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
        pdVar6 = (double *)
                 ((long)(this->test_matrix_).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_data + uVar4);
        for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
          *pdVar6 = (double)*(byte *)(*(long *)(image_data_.
                                                super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>
                                                ._M_impl.super__Vector_impl_data._M_start +
                                               lVar5 * 0x60 + 0x10) + uVar7);
          pdVar6 = pdVar6 + lVar1;
        }
        uVar4 = uVar4 + 8;
      }
      std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&image_data_);
      std::__cxx11::string::~string((string *)&input_str);
    }
    std::ifstream::~ifstream(&file);
    return;
  }
  puts("couldn\'t find test_config_path");
  return;
}

Assistant:

void NPca::setTestMatrix(const string test_config_path)
{
    if (test_config_path.length() <= 0)
    {
        printf("couldn't find test_config_path\n");
        return;
    }

    ifstream file(test_config_path.c_str());

    if (!file.is_open())
    {
        printf("couldn't open test_config_path: %s\n", test_config_path.c_str());
        return;
    }

    string input_str;
    int count = 0;
    int size = n_config_->image_height_ * n_config_->image_width_;
    vector<Mat> image_data_;

    while (getline(file, input_str))
    {
        vector<string> read_data = n_config_->n_split(input_str, ' ');

        if (read_data.size() < 2)
            continue;
        
        Mat image;
        try{
            image = imread(read_data[0].c_str(), IMREAD_GRAYSCALE);
            
            if (image.empty())
                continue;

        } catch (Exception e) {
            continue;
        }

        // n_resize
        if (image.cols != n_config_->image_width_ || image.rows != n_config_->image_height_)
        {
            n_resize(image);
        }

        Mat reshap_image = image.reshape(0, 1);
        image_data_.push_back(reshap_image);
        test_label_.push_back(atoi(read_data[1].c_str()));
    }
    
    // set test_matrix
    test_matrix_ = MatrixXd::Zero(image_data_.size(), size);

    for (int i = 0; i < image_data_.size(); i++)
    {
        for (int j = 0; j < size; j++)
        {
            test_matrix_.coeffRef(i, j) = image_data_[i].data[j];
        }
    }
}